

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O3

void __thiscall dlib::timer<dlib::text_grid>::thread(timer<dlib::text_grid> *this)

{
  code *pcVar1;
  auto_mutex M;
  auto_mutex local_20;
  
  pcVar1 = (code *)this->af;
  if (((ulong)pcVar1 & 1) != 0) {
    pcVar1 = *(code **)(pcVar1 + *(long *)((long)&(this->ao->super_scrollable_region).super_drawable
                                                  ._vptr_drawable + *(long *)&this->field_0xa8) + -1
                       );
  }
  (*pcVar1)();
  local_20.m = &((this->gc).super___shared_ptr<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->m;
  local_20.r = (rmutex *)0x0;
  local_20.rw = (read_write_mutex *)0x0;
  pthread_mutex_lock((pthread_mutex_t *)local_20.m);
  if ((this->super_timer_base).running == true) {
    timer_global_clock::remove
              ((this->gc).super___shared_ptr<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(char *)this);
    timer_global_clock::add
              ((this->gc).super___shared_ptr<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,&this->super_timer_base);
  }
  auto_mutex::unlock(&local_20);
  return;
}

Assistant:

void timer<T>::
    thread (
    )
    {
        // call the action function
        (ao.*af)(); 
        auto_mutex M(gc->m);
        if (running)
        {
            gc->remove(this);
            gc->add(this);
        }
    }